

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>::
~DeviceObjectBase(DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                  *this)

{
  IMemoryAllocator *pIVar1;
  DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
  *this_local;
  
  (this->super_ObjectBase<Diligent::IRenderPass>).super_RefCountedObject<Diligent::IRenderPass>.
  super_IRenderPass.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_005918b0;
  pIVar1 = GetStringAllocator();
  (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,(this->m_Desc).super_DeviceObjectAttribs.Name);
  if ((this->m_bIsDeviceInternal & 1U) == 0) {
    RenderDeviceBase<Diligent::EngineGLImplTraits>::Release
              (&this->m_pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  }
  RefCntAutoPtr<Diligent::IObject>::~RefCntAutoPtr(&this->m_pUserData);
  ObjectBase<Diligent::IRenderPass>::~ObjectBase(&this->super_ObjectBase<Diligent::IRenderPass>);
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }